

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

void __thiscall cmdline::cmdline_error::cmdline_error(cmdline_error *this,string *msg)

{
  string *in_RSI;
  exception *in_RDI;
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__cmdline_error_00118ae0;
  std::__cxx11::string::string((string *)(in_RDI + 8),in_RSI);
  return;
}

Assistant:

cmdline_error(const std::string &msg): msg(msg){}